

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

int __thiscall RandomBotStrategy::intInput(RandomBotStrategy *this,StrategyContext context)

{
  CardType CVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  pointer ppCVar3;
  vector<CardType,_std::allocator<CardType>_> *pvVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  size_t __i;
  long lVar8;
  pointer pCVar9;
  ulong uVar10;
  mt19937 gen;
  uniform_int_distribution<int> dis;
  random_device rd;
  uniform_int_distribution<int> local_3ac0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_3ab8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2730;
  random_device local_13a8;
  
  std::random_device::random_device(&local_13a8);
  uVar5 = std::random_device::_M_getval();
  local_3ab8._M_x[0] = (unsigned_long)uVar5;
  lVar8 = 1;
  uVar10 = local_3ab8._M_x[0];
  do {
    uVar10 = (ulong)(((uint)(uVar10 >> 0x1e) ^ (uint)uVar10) * 0x6c078965 + (int)lVar8);
    local_3ab8._M_x[lVar8] = uVar10;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_3ab8._M_p = 0x270;
  iVar6 = 0;
  switch(context) {
  case ATTACK_FROM_COUNTRY:
    memcpy(&local_2730,&local_3ab8,5000);
    pvVar2 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
    local_3ac0._M_param._M_b =
         (int)((ulong)((long)(pvVar2->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar2->
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    local_3ac0._M_param._M_a = 0;
    iVar6 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,&local_2730,&local_3ac0._M_param);
    goto LAB_0010ac9f;
  case ATTACK_TO_COUNTRY:
    memcpy(&local_2730,&local_3ab8,5000);
    pvVar2 = ((this->super_PlayerStrategy).from)->pAdjCountries;
    local_3ac0._M_param._M_b =
         (int)((ulong)((long)(pvVar2->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar2->
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    local_3ac0._M_param._M_a = 0;
    iVar6 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,&local_2730,&local_3ac0._M_param);
    goto LAB_0010ad5f;
  case ATTACK_DICE_COUNT:
    memcpy(&local_2730,&local_3ab8,5000);
    iVar6 = *((this->super_PlayerStrategy).from)->pNumberOfTroops;
    local_3ac0._M_param._M_b = 3;
    if (iVar6 < 4) {
      local_3ac0._M_param._M_b = (iVar6 == 3) + 1;
    }
    local_3ac0._M_param._M_a = 1;
    iVar6 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,&local_2730,&local_3ac0._M_param);
    break;
  case ATTACK_NEW_ARMY_COUNT:
    memcpy(&local_2730,&local_3ab8,5000);
    local_3ac0._M_param._M_b = *((this->super_PlayerStrategy).from)->pNumberOfTroops + -1;
    local_3ac0._M_param._M_a = 0;
    iVar6 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,&local_2730,&local_3ac0._M_param);
    break;
  case DEFEND_DICE_COUNT:
    local_2730._M_x[0]._4_4_ = (1 < *((this->super_PlayerStrategy).to)->pNumberOfTroops) + 1;
    local_2730._M_x[0]._0_4_ = 1;
    iVar6 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_2730,&local_3ab8,
                       (param_type *)&local_2730);
    break;
  case FORTIFY_FROM_COUNTRY:
    memcpy(&local_2730,&local_3ab8,5000);
    pvVar2 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
    local_3ac0._M_param._M_b =
         (int)((ulong)((long)(pvVar2->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar2->
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    local_3ac0._M_param._M_a = 0;
    iVar6 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,&local_2730,&local_3ac0._M_param);
LAB_0010ac9f:
    pvVar2 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
    uVar10 = (ulong)iVar6;
    ppCVar3 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3) <= uVar10) {
LAB_0010af47:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10)
      ;
    }
    (this->super_PlayerStrategy).from = ppCVar3[uVar10];
    break;
  case FORTIFY_TO_COUNTRY:
    memcpy(&local_2730,&local_3ab8,5000);
    pvVar2 = ((this->super_PlayerStrategy).from)->pAdjCountries;
    local_3ac0._M_param._M_b =
         (int)((ulong)((long)(pvVar2->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar2->
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    local_3ac0._M_param._M_a = 0;
    iVar6 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,&local_2730,&local_3ac0._M_param);
LAB_0010ad5f:
    pvVar2 = ((this->super_PlayerStrategy).from)->pAdjCountries;
    uVar10 = (ulong)iVar6;
    ppCVar3 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (uVar10 < (ulong)((long)(pvVar2->
                               super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3)) {
      (this->super_PlayerStrategy).to = ppCVar3[uVar10];
      break;
    }
    goto LAB_0010af47;
  case FORTIFY_ARMY_COUNT:
    memcpy(&local_2730,&local_3ab8,5000);
    local_3ac0._M_param._M_b = *((this->super_PlayerStrategy).from)->pNumberOfTroops + -1;
    local_3ac0._M_param._M_a = 0;
    iVar6 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,&local_2730,&local_3ac0._M_param);
    break;
  case REINFORCE_CARD_COUNT:
    CVar1 = *(this->super_PlayerStrategy).exchangingCardType;
    memcpy(&local_2730,&local_3ab8,5000);
    pvVar4 = ((this->super_PlayerStrategy).player)->pCards->handPointer;
    local_3ac0._M_param._M_b = 0;
    for (pCVar9 = (pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar9 != (pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                  super__Vector_impl_data._M_finish; pCVar9 = pCVar9 + 1) {
      local_3ac0._M_param._M_b = local_3ac0._M_param._M_b + (uint)(*pCVar9 == CVar1);
    }
    local_3ac0._M_param._M_a = 0;
    iVar6 = std::uniform_int_distribution<int>::operator()
                      (&local_3ac0,&local_2730,&local_3ac0._M_param);
    break;
  case REINFORCE_ARMY_COUNT:
    local_2730._M_x[0]._4_4_ = *(this->super_PlayerStrategy).armiesToPlace;
    local_2730._M_x[0]._0_4_ = 0;
    iVar6 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_2730,&local_3ab8,
                       (param_type *)&local_2730);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  plVar7 = (long *)std::ostream::operator<<(&std::cout,iVar6);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::random_device::_M_fini();
  return iVar6;
}

Assistant:

int RandomBotStrategy::intInput(StrategyContext context) {
    int userInput = 0;
    std::random_device rd; // random number generator
    std::mt19937 gen(rd()); // seed the generator
    switch((int) context) {
        case StrategyContext::ATTACK_FROM_COUNTRY: {
            userInput = RandomBotStrategy::chooseRandomCountry(gen);
            from = player->getOwnedCountries()->at(userInput);
        } break;
        case StrategyContext::ATTACK_TO_COUNTRY: {
            userInput = RandomBotStrategy::chooseRandomNeighbour(gen);
            to = from->getAdjCountries()->at(userInput);
        } break;
        case StrategyContext::ATTACK_DICE_COUNT: {
            userInput = RandomBotStrategy::attackMaxDice(gen);
        } break;
        case StrategyContext::DEFEND_DICE_COUNT: {
            int maxDice = (to->getNumberOfTroops() >= 2) ? 2 : 1;
            std::uniform_int_distribution<> dis(1, maxDice);
            userInput = dis(gen);
        } break;
        case StrategyContext::FORTIFY_FROM_COUNTRY: {
            userInput = RandomBotStrategy::chooseRandomCountry(gen);
            from = player->getOwnedCountries()->at(userInput);
        } break;
        case StrategyContext::FORTIFY_TO_COUNTRY: {
            userInput = RandomBotStrategy::chooseRandomNeighbour(gen);
            to = from->getAdjCountries()->at(userInput);
        } break;
        case StrategyContext::FORTIFY_ARMY_COUNT: {
            userInput = RandomBotStrategy::sendRandomArmies(gen);
        } break;
        case StrategyContext::ATTACK_NEW_ARMY_COUNT: {
            userInput = RandomBotStrategy::sendRandomArmies(gen);
        } break;
        case StrategyContext::REINFORCE_CARD_COUNT: {
            userInput = RandomBotStrategy::reinforceMaxCards(gen, *exchangingCardType);
        } break;
        case StrategyContext::REINFORCE_ARMY_COUNT: {
            std::uniform_int_distribution<> dis(0, *armiesToPlace);
            userInput = dis(gen);
        }
    }
    std::cout << " " << userInput << std::endl;
    return userInput;
}